

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.hpp
# Opt level: O0

void __thiscall
TridiagonalMatrix::TridiagonalMatrix(TridiagonalMatrix *this,vec *as,vec *bs,vec *cs)

{
  size_type sVar1;
  vec *cs_local;
  vec *bs_local;
  vec *as_local;
  TridiagonalMatrix *this_local;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->as,as);
  std::vector<double,_std::allocator<double>_>::vector(&this->bs,bs);
  std::vector<double,_std::allocator<double>_>::vector(&this->cs,cs);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(as);
  this->size = (int)sVar1;
  return;
}

Assistant:

TridiagonalMatrix(const vec& as, const vec& bs, const vec& cs):
        as(as), bs(bs), cs(cs), size(as.size()) {}